

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content<httplib::Request>
               (Stream *strm,Request *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiverWithProgress *receiver,bool decompress)

{
  anon_class_40_5_1ac14285 callback;
  bool bVar1;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_60;
  byte local_39;
  ContentReceiverWithProgress *pCStack_38;
  bool decompress_local;
  ContentReceiverWithProgress *receiver_local;
  Progress *progress_local;
  int *status_local;
  size_t payload_max_length_local;
  Request *x_local;
  Stream *strm_local;
  
  local_39 = decompress;
  pCStack_38 = receiver;
  receiver_local = (ContentReceiverWithProgress *)progress;
  progress_local = (Progress *)status;
  status_local = (int *)payload_max_length;
  payload_max_length_local = (size_t)x;
  x_local = (Request *)strm;
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            (&local_60,receiver);
  callback.strm = (Stream *)x_local;
  callback.x = (Request *)payload_max_length_local;
  callback.payload_max_length = (size_t *)&status_local;
  callback.progress = progress;
  callback.status = (int *)progress_local;
  bVar1 = prepare_content_receiver<httplib::Request,httplib::detail::read_content<httplib::Request>(httplib::Stream&,httplib::Request&,unsigned_long,int&,std::function<bool(unsigned_long,unsigned_long)>,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>,bool)::_lambda(std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>const&)_1_>
                    (x,status,&local_60,(bool)(local_39 & 1),callback);
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            (&local_60);
  return bVar1;
}

Assistant:

bool read_content(Stream &strm, T &x, size_t payload_max_length, int &status,
                  Progress progress, ContentReceiverWithProgress receiver,
                  bool decompress) {
  return prepare_content_receiver(
      x, status, std::move(receiver), decompress,
      [&](const ContentReceiverWithProgress &out) {
        auto ret = true;
        auto exceed_payload_max_length = false;

        if (is_chunked_transfer_encoding(x.headers)) {
          ret = read_content_chunked(strm, out);
        } else if (!has_header(x.headers, "Content-Length")) {
          ret = read_content_without_length(strm, out);
        } else {
          auto len = get_header_value<uint64_t>(x.headers, "Content-Length");
          if (len > payload_max_length) {
            exceed_payload_max_length = true;
            skip_content_with_length(strm, len);
            ret = false;
          } else if (len > 0) {
            ret = read_content_with_length(strm, len, std::move(progress), out);
          }
        }

        if (!ret) { status = exceed_payload_max_length ? 413 : 400; }
        return ret;
      });
}